

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_simd.cpp
# Opt level: O2

void multikey_simd_b_1(uchar **strings,size_t n)

{
  int iVar1;
  uint8_t *in_RAX;
  uchar **sorted;
  uint8_t *oracle;
  uint8_t *local_28;
  
  local_28 = in_RAX;
  sorted = (uchar **)malloc(n * 8);
  iVar1 = posix_memalign(&local_28,0x10,n);
  oracle = (uint8_t *)0x0;
  if (iVar1 == 0) {
    oracle = local_28;
  }
  multikey_simd_b<unsigned_char>(strings,n,0,sorted,oracle);
  free(oracle);
  free(sorted);
  return;
}

Assistant:

void multikey_simd_b_1(unsigned char** strings, size_t n)
{
	unsigned char** sorted =
		static_cast<unsigned char**>(malloc(n*sizeof(unsigned char*)));
	uint8_t* const restrict oracle =
		static_cast<uint8_t*>(_mm_malloc(n, 16));
	multikey_simd_b<unsigned char>(strings, n, 0, sorted, oracle);
	_mm_free(oracle);
	free(sorted);
}